

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O2

void __thiscall SLogLib::LoggingManagerPriv::~LoggingManagerPriv(LoggingManagerPriv *this)

{
  long *plVar1;
  LoggingManagerPriv *pLVar2;
  
  std::mutex::lock(&this->mLoggingDevicesMutex);
  pLVar2 = this;
  while (pLVar2 = (LoggingManagerPriv *)
                  (pLVar2->mLoggingDevices).
                  super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pLVar2 != this) {
    plVar1 = (long *)(pLVar2->mLoggingDevices).
                     super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                     ._M_impl._M_node._M_size;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  LOCK();
  _ZN7SLogLibL25gLoggingManagerDestructedE_0 = 1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mLoggingDevicesMutex);
  std::__cxx11::
  _List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>::
  _M_clear((_List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
            *)this);
  return;
}

Assistant:

~LoggingManagerPriv()
	{
		// Destructor should be called by the main thread, just before program dies.
		std::lock_guard<std::mutex> _lock(mLoggingDevicesMutex);
		for(AbstractLoggingDevice* _device : mLoggingDevices)
		{
			delete _device;
		}
		
		gLoggingManagerDestructed = true;
	}